

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::resolve
          (PromiseClient *this,Own<capnp::ClientHook> *replacement,bool isError)

{
  StructDataBitCount *this_00;
  PromiseNode **this_01;
  Builder target;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ClientHook *pCVar4;
  undefined4 extraout_var;
  RpcConnectionState *pRVar5;
  Own<capnp::_::VatNetworkBase::Connection> *this_02;
  Connection *pCVar6;
  OutgoingRpcMessage *pOVar7;
  Embargo *this_03;
  Own<kj::PromiseFulfiller<void>_> *t;
  Promise<kj::Own<capnp::ClientHook>_> *promise;
  Own<capnp::ClientHook> *other;
  Own<capnp::ClientHook> local_198;
  undefined1 local_181;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:986:40),_kj::Own<capnp::ClientHook>_>
  local_180;
  undefined1 local_168 [8];
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:986:40),_kj::Own<capnp::ClientHook>_>,_void>
  embargoPromise;
  undefined1 local_148 [8];
  PromiseFulfillerPair<void> paf;
  Embargo *embargo;
  EmbargoId embargoId;
  Fault f;
  CapTableBuilder *pCStack_e0;
  void *local_d8;
  WirePointer *pWStack_d0;
  Type *local_c8;
  undefined1 local_c0 [8];
  Maybe<kj::Own<capnp::ClientHook>_> redirect;
  BuilderFor<capnp::rpc::Message> local_88;
  undefined1 local_60 [8];
  Builder disembargo;
  Own<capnp::OutgoingRpcMessage> message;
  void *replacementBrand;
  bool isError_local;
  Own<capnp::ClientHook> *replacement_local;
  PromiseClient *this_local;
  
  pCVar4 = kj::Own<capnp::ClientHook>::operator->(replacement);
  iVar2 = (*pCVar4->_vptr_ClientHook[5])();
  pRVar5 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::get
                     (&(this->super_RpcClient).connectionState);
  if (((((RpcConnectionState *)CONCAT44(extraout_var,iVar2) != pRVar5) &&
       ((RpcConnectionState *)CONCAT44(extraout_var,iVar2) !=
        (RpcConnectionState *)&ClientHook::NULL_CAPABILITY_BRAND)) &&
      ((this->receivedCall & 1U) != 0)) && (!isError)) {
    pRVar5 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator->
                       (&(this->super_RpcClient).connectionState);
    bVar1 = kj::OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception>::
            is<kj::Own<capnp::_::VatNetworkBase::Connection>>
                      ((OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception> *)
                       &pRVar5->connection);
    if (bVar1) {
      pRVar5 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator->
                         (&(this->super_RpcClient).connectionState);
      this_02 = kj::OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception>::
                get<kj::Own<capnp::_::VatNetworkBase::Connection>>
                          ((OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception> *)
                           &pRVar5->connection);
      pCVar6 = kj::Own<capnp::_::VatNetworkBase::Connection>::operator->(this_02);
      uVar3 = messageSizeHint<capnp::rpc::Disembargo>();
      this_00 = &disembargo._builder.dataSize;
      (**pCVar6->_vptr_Connection)(this_00,pCVar6,(ulong)(uVar3 + 0x14));
      pOVar7 = kj::Own<capnp::OutgoingRpcMessage>::operator->
                         ((Own<capnp::OutgoingRpcMessage> *)this_00);
      (**pOVar7->_vptr_OutgoingRpcMessage)(&stack0xffffffffffffff60);
      AnyPointer::Builder::initAs<capnp::rpc::Message>
                (&local_88,(Builder *)&stack0xffffffffffffff60);
      rpc::Message::Builder::initDisembargo((Builder *)local_60,&local_88);
      pRVar5 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator->
                         (&(this->super_RpcClient).connectionState);
      kj::Own<capnp::ClientHook>::operator*(&this->cap);
      rpc::Disembargo::Builder::initTarget((Builder *)&f,(Builder *)local_60);
      target._builder.capTable = pCStack_e0;
      target._builder.segment = (SegmentBuilder *)f.exception;
      target._builder.data = local_d8;
      target._builder.pointers = pWStack_d0;
      target._builder._32_8_ = local_c8;
      RpcConnectionState::writeTarget((RpcConnectionState *)local_c0,(ClientHook *)pRVar5,target);
      bVar1 = kj::Maybe<kj::Own<capnp::ClientHook>_>::operator==
                        ((Maybe<kj::Own<capnp::ClientHook>_> *)local_c0,(void *)0x0);
      if (!bVar1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                  ((Fault *)&stack0xffffffffffffff10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x3cd,FAILED,"redirect == nullptr",
                   "\"Original promise target should always be from this RPC connection.\"",
                   (char (*) [67])
                   "Original promise target should always be from this RPC connection.");
        kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff10);
      }
      kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe((Maybe<kj::Own<capnp::ClientHook>_> *)local_c0)
      ;
      pRVar5 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator->
                         (&(this->super_RpcClient).connectionState);
      this_03 = ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>
                ::next(&pRVar5->embargoes,(uint *)((long)&embargo + 4));
      rpc::Disembargo::Builder::getContext((Builder *)&paf.fulfiller.ptr,(Builder *)local_60);
      rpc::Disembargo::Context::Builder::setSenderLoopback
                ((Builder *)&paf.fulfiller.ptr,embargo._4_4_);
      kj::newPromiseAndFulfiller<void>();
      t = kj::mv<kj::Own<kj::PromiseFulfiller<void>>>
                    ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
      this_01 = &embargoPromise.super_PromiseBase.node.ptr;
      kj::Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe
                ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)this_01,t);
      kj::Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
                (&this_03->fulfiller,(Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)this_01);
      kj::Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe
                ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)
                 &embargoPromise.super_PromiseBase.node.ptr);
      kj::
      mvCapture<capnp::_::(anonymous_namespace)::RpcConnectionState::PromiseClient::resolve(kj::Own<capnp::ClientHook>,bool)::_lambda(kj::Own<capnp::ClientHook>&&)_1_,kj::Own<capnp::ClientHook>&>
                (&local_180,(kj *)replacement,(Own<capnp::ClientHook> *)&local_181,local_c8);
      kj::Promise<void>::
      then<kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::PromiseClient::resolve(kj::Own<capnp::ClientHook>,bool)::_lambda(kj::Own<capnp::ClientHook>&&)_1_,kj::Own<capnp::ClientHook>>,kj::_::PropagateException>
                ((Promise<void> *)local_168,
                 (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:986:40),_kj::Own<capnp::ClientHook>_>
                  *)local_148,(PropagateException *)&local_180);
      kj::
      CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:986:40),_kj::Own<capnp::ClientHook>_>
      ::~CaptureByMove(&local_180);
      promise = kj::mv<kj::Promise<kj::Own<capnp::ClientHook>>>
                          ((Promise<kj::Own<capnp::ClientHook>_> *)local_168);
      newLocalPromiseClient((capnp *)&local_198,promise);
      kj::Own<capnp::ClientHook>::operator=(replacement,&local_198);
      kj::Own<capnp::ClientHook>::~Own(&local_198);
      pOVar7 = kj::Own<capnp::OutgoingRpcMessage>::operator->
                         ((Own<capnp::OutgoingRpcMessage> *)&disembargo._builder.dataSize);
      (*pOVar7->_vptr_OutgoingRpcMessage[1])();
      kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise
                ((Promise<kj::Own<capnp::ClientHook>_> *)local_168);
      kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_148)
      ;
      kj::Own<capnp::OutgoingRpcMessage>::~Own
                ((Own<capnp::OutgoingRpcMessage> *)&disembargo._builder.dataSize);
    }
  }
  other = kj::mv<kj::Own<capnp::ClientHook>>(replacement);
  kj::Own<capnp::ClientHook>::operator=(&this->cap,other);
  this->isResolved = true;
  return;
}

Assistant:

void resolve(kj::Own<ClientHook> replacement, bool isError) {
      const void* replacementBrand = replacement->getBrand();
      if (replacementBrand != connectionState.get() &&
          replacementBrand != &ClientHook::NULL_CAPABILITY_BRAND &&
          receivedCall && !isError && connectionState->connection.is<Connected>()) {
        // The new capability is hosted locally, not on the remote machine.  And, we had made calls
        // to the promise.  We need to make sure those calls echo back to us before we allow new
        // calls to go directly to the local capability, so we need to set a local embargo and send
        // a `Disembargo` to echo through the peer.

        auto message = connectionState->connection.get<Connected>()->newOutgoingMessage(
            messageSizeHint<rpc::Disembargo>() + MESSAGE_TARGET_SIZE_HINT);

        auto disembargo = message->getBody().initAs<rpc::Message>().initDisembargo();

        {
          auto redirect = connectionState->writeTarget(*cap, disembargo.initTarget());
          KJ_ASSERT(redirect == nullptr,
                    "Original promise target should always be from this RPC connection.");
        }

        EmbargoId embargoId;
        Embargo& embargo = connectionState->embargoes.next(embargoId);

        disembargo.getContext().setSenderLoopback(embargoId);

        auto paf = kj::newPromiseAndFulfiller<void>();
        embargo.fulfiller = kj::mv(paf.fulfiller);

        // Make a promise which resolves to `replacement` as soon as the `Disembargo` comes back.
        auto embargoPromise = paf.promise.then(
            kj::mvCapture(replacement, [](kj::Own<ClientHook>&& replacement) {
              return kj::mv(replacement);
            }));

        // We need to queue up calls in the meantime, so we'll resolve ourselves to a local promise
        // client instead.
        replacement = newLocalPromiseClient(kj::mv(embargoPromise));

        // Send the `Disembargo`.
        message->send();
      }

      cap = kj::mv(replacement);
      isResolved = true;
    }